

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator=
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = matrix->size_;
  if (lVar4 != this->size_) {
    this->size_ = lVar4;
    if (lVar4 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                    ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
    }
    pdVar2 = (double *)
             operator_new__(-(ulong)((ulong)(lVar4 * lVar4) >> 0x3d != 0) | lVar4 * lVar4 * 8);
    pdVar1 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar2;
    if (pdVar1 == (double *)0x0) goto LAB_0010cd7d;
    operator_delete__(pdVar1);
    lVar4 = this->size_;
  }
  if (lVar4 == 0) {
    return this;
  }
LAB_0010cd7d:
  pdVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  pdVar2 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  lVar3 = 0;
  do {
    pdVar2[lVar3] = pdVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar4 * lVar4 + (ulong)(lVar4 * lVar4 == 0) != lVar3);
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }